

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixin_inheritance.cpp
# Opt level: O3

string * __thiscall
TransparentShape<ColoredShape<Circle>>::str_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  long *local_98;
  ulong local_90;
  long local_88;
  undefined8 uStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  ColoredShape<Circle>::str_abi_cxx11_(&local_38,(ColoredShape<Circle> *)this);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_68 = *puVar4;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar4;
    local_78 = (ulong *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_58,vsnprintf,0x3a,"%f",
             SUB84((double)(((float)*(byte *)((long)this + 0x10) / 255.0) * 100.0),0));
  uVar6 = 0xf;
  if (local_78 != &local_68) {
    uVar6 = local_68;
  }
  if (uVar6 < local_58._M_string_length + local_70) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar7 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_70 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
      goto LAB_001026d4;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
LAB_001026d4:
  local_98 = &local_88;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_88 = *plVar2;
    uStack_80 = puVar3[3];
  }
  else {
    local_88 = *plVar2;
    local_98 = (long *)*puVar3;
  }
  local_90 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_98,local_90,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str() const override
	{
		return T::str() + " with transparency " + std::to_string(transparency / 255.0f * 100) + '%';
	}